

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

bool jessilib::equalsi<char8_t,char>
               (basic_string_view<char8_t,_std::char_traits<char8_t>_> lhs,
               basic_string_view<char,_std::char_traits<char>_> rhs)

{
  int iVar1;
  int iVar2;
  jessilib *extraout_RDX;
  jessilib *pjVar4;
  jessilib *this;
  char8_t *pcVar5;
  jessilib *this_00;
  char *pcVar6;
  decode_result dVar7;
  decode_result dVar8;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  jessilib *pjVar3;
  
  pcVar5 = lhs._M_str;
  this_00 = (jessilib *)lhs._M_len;
  pcVar6 = rhs._M_str;
  this = (jessilib *)rhs._M_len;
  pjVar4 = this;
  while( true ) {
    if (this_00 == (jessilib *)0x0) {
      return this == (jessilib *)0x0;
    }
    if (this == (jessilib *)0x0) {
      return false;
    }
    in_string._M_str = (char8_t *)pjVar4;
    in_string._M_len = (size_t)pcVar5;
    dVar7 = decode_codepoint_utf8<char8_t>(this_00,in_string);
    in_string_00._M_str = (char *)dVar7.units;
    in_string_00._M_len = (size_t)pcVar6;
    dVar8 = decode_codepoint_utf8<char>(this,in_string_00);
    pjVar3 = (jessilib *)dVar8.units;
    if (in_string_00._M_str == (char *)0x0) {
      return false;
    }
    if (pjVar3 == (jessilib *)0x0) break;
    pjVar4 = pjVar3;
    if (dVar7.codepoint != dVar8.codepoint) {
      iVar1 = jessilib::fold(dVar7.codepoint);
      iVar2 = jessilib::fold(dVar8.codepoint);
      pjVar4 = extraout_RDX;
      if (iVar1 != iVar2) {
        return false;
      }
    }
    pcVar5 = pcVar5 + (long)in_string_00._M_str;
    pcVar6 = pcVar6 + (long)pjVar3;
    this = this + -(long)pjVar3;
    this_00 = this_00 + -(long)in_string_00._M_str;
  }
  return false;
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}